

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

void __thiscall dg::AllMaxPath::compute(AllMaxPath *this,CDGraph *graph,CDNode *target)

{
  unsigned_short *puVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer ppCVar5;
  mapped_type *pmVar6;
  CDNode *pCVar7;
  pointer ppCVar8;
  pointer puVar9;
  CDNode *pred;
  QueueLIFO<dg::CDNode_*> queue;
  CDNode *local_90;
  CDNode *local_88;
  QueueLIFO<dg::CDNode_*> local_80;
  
  puVar4 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = target;
  for (puVar9 = (graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    local_80.Container.c.super__Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)
         (puVar9->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t.
         super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
         super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
    iVar2 = *(int *)((long)&(((CDNode *)
                             local_80.Container.c.
                             super__Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                             super__Deque_impl_data._M_map)->super_ElemWithEdges<dg::CDNode>).
                            _successors + 8);
    iVar3 = *(int *)&(((CDNode *)
                      local_80.Container.c.
                      super__Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                      super__Deque_impl_data._M_map)->super_ElemWithEdges<dg::CDNode>)._successors;
    pmVar6 = std::__detail::
             _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&local_80);
    pmVar6->counter = (unsigned_short)((uint)(iVar2 - iVar3) >> 3);
  }
  pmVar6 = std::__detail::
           _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_90);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  ::set(&pmVar6->colors,(ulong)local_90->_id);
  std::stack<dg::CDNode*,std::deque<dg::CDNode*,std::allocator<dg::CDNode*>>>::
  stack<std::deque<dg::CDNode*,std::allocator<dg::CDNode*>>,void>(&local_80.Container);
  std::deque<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::push_back
            ((deque<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)&local_80,&local_90);
  while (local_80.Container.c.super__Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl
         .super__Deque_impl_data._M_finish._M_cur !=
         local_80.Container.c.super__Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl
         .super__Deque_impl_data._M_start._M_cur) {
    pCVar7 = ADT::QueueLIFO<dg::CDNode_*>::pop(&local_80);
    ppCVar5 = (pCVar7->super_ElemWithEdges<dg::CDNode>)._predecessors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar8 = (pCVar7->super_ElemWithEdges<dg::CDNode>)._predecessors.
                   super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar8 != ppCVar5; ppCVar8 = ppCVar8 + 1) {
      local_88 = *ppCVar8;
      pmVar6 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_88);
      puVar1 = &pmVar6->counter;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
        ::set(&pmVar6->colors,(ulong)local_90->_id);
        std::deque<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::push_back
                  ((deque<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)&local_80,&local_88);
      }
    }
  }
  std::_Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::~_Deque_base
            ((_Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)&local_80);
  return;
}

Assistant:

void compute(CDGraph &graph, CDNode *target) {
        // initialize nodes
        for (auto *nd : graph) {
            data[nd].counter = nd->successors().size();
        }

        // initialize the search
        data[target].colors.set(target->getID());
        ADT::QueueLIFO<CDNode *> queue;
        queue.push(target);

        // search!
        while (!queue.empty()) {
            auto *node = queue.pop();
            assert(data[node].colors.get(target->getID()) &&
                   "A non-colored node in queue");

            for (auto *pred : node->predecessors()) {
                auto &D = data[pred];
                --D.counter;
                if (D.counter == 0) {
                    D.colors.set(target->getID());
                    queue.push(pred);
                }
            }
        }
    }